

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CMU462::Viewer::err_callback(int error,char *description)

{
  ostream *poVar1;
  void *this;
  char *description_local;
  int error_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
  poVar1 = std::operator<<(poVar1,"[CMU462] ");
  poVar1 = std::operator<<(poVar1,"\x1b[0m");
  poVar1 = std::operator<<(poVar1,"GLFW Error: ");
  poVar1 = std::operator<<(poVar1,description);
  this = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void Viewer::err_callback( int error, const char* description ) {
    out_err( "GLFW Error: " << description );
}